

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

bool __thiscall
ddd::DaTrie<false,_false,_false>::insert_key(DaTrie<false,_false,_false> *this,Query *query)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  DaTrie<false,_false,_false> *unaff_retaddr;
  DaTrie<false,_false,_false> *in_stack_00000020;
  Query *in_stack_00000128;
  DaTrie<false,_false,_false> *in_stack_00000130;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *blocks;
  undefined4 in_stack_fffffffffffffff8;
  uint32_t in_stack_fffffffffffffffc;
  
  blocks = in_RDI;
  bVar1 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::empty(in_RDI);
  if (bVar1) {
    fix_(unaff_retaddr,in_stack_fffffffffffffffc,
         (vector<ddd::Block,_std::allocator<ddd::Block>_> *)blocks);
    pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,0);
    Bc::set_check(pvVar3,0x7fffffff);
    insert_tail_(in_stack_00000020,(Query *)this);
    bVar1 = true;
  }
  else {
    bVar1 = search_key(this,query);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      uVar2 = Query::node_pos(in_RSI);
      pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar2);
      bVar1 = Bc::is_leaf(pvVar3);
      if (bVar1) {
        insert_branch_(in_stack_00000130,in_stack_00000128);
      }
      else {
        insert_edge_(unaff_retaddr,
                     (Query *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
      insert_tail_(in_stack_00000020,(Query *)this);
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool insert_key(Query& query) {
    assert(!Prefix);

    if (bc_.empty()) { // first insert
      fix_(ROOT_POS, blocks_);
      bc_[ROOT_POS].set_check(INVALID_VALUE);
      insert_tail_(query);
      return true;
    }

    if (search_key(query)) {
      return false;
    }

    bc_[query.node_pos()].is_leaf() ? insert_branch_(query) : insert_edge_(query);
    insert_tail_(query);
    return true;
  }